

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lundump.c
# Opt level: O2

void LoadFunction(LoadState *S,Proto *f,TString *psource)

{
  lu_byte lVar1;
  byte bVar2;
  int iVar3;
  uint uVar4;
  TString *pTVar5;
  Instruction *b;
  TValue *pTVar6;
  lua_Integer lVar7;
  Upvaldesc *pUVar8;
  Proto **ppPVar9;
  Proto *pPVar10;
  int *b_00;
  LocVar *pLVar11;
  long lVar12;
  ulong uVar13;
  ulong uVar14;
  lua_Number lVar15;
  
  pTVar5 = LoadString(S);
  if (pTVar5 != (TString *)0x0) {
    psource = pTVar5;
  }
  f->source = psource;
  iVar3 = LoadInt(S);
  f->linedefined = iVar3;
  iVar3 = LoadInt(S);
  f->lastlinedefined = iVar3;
  lVar1 = LoadByte(S);
  f->numparams = lVar1;
  lVar1 = LoadByte(S);
  f->is_vararg = lVar1;
  lVar1 = LoadByte(S);
  f->maxstacksize = lVar1;
  iVar3 = LoadInt(S);
  lVar12 = 0;
  b = (Instruction *)luaM_realloc_(S->L,(void *)0x0,0,(long)iVar3 * 4);
  f->code = b;
  f->sizecode = iVar3;
  LoadBlock(S,b,(long)iVar3 * 4);
  uVar4 = LoadInt(S);
  pTVar6 = (TValue *)luaM_realloc_(S->L,(void *)0x0,0,(long)(int)uVar4 << 4);
  f->k = pTVar6;
  f->sizek = uVar4;
  uVar13 = 0;
  if (0 < (int)uVar4) {
    uVar13 = (ulong)uVar4;
  }
  for (; uVar13 * 0x10 != lVar12; lVar12 = lVar12 + 0x10) {
    *(undefined4 *)((long)&pTVar6->tt_ + lVar12) = 0;
  }
  lVar12 = 0;
  do {
    if (uVar13 * 0x10 == lVar12) {
      uVar4 = LoadInt(S);
      lVar12 = 0;
      pUVar8 = (Upvaldesc *)luaM_realloc_(S->L,(void *)0x0,0,(long)(int)uVar4 << 4);
      f->upvalues = pUVar8;
      f->sizeupvalues = uVar4;
      uVar13 = 0;
      if (0 < (int)uVar4) {
        uVar13 = (ulong)uVar4;
      }
      for (; uVar13 * 0x10 != lVar12; lVar12 = lVar12 + 0x10) {
        *(undefined8 *)((long)&pUVar8->name + lVar12) = 0;
      }
      for (lVar12 = 0; uVar13 * 0x10 != lVar12; lVar12 = lVar12 + 0x10) {
        lVar1 = LoadByte(S);
        (&f->upvalues->instack)[lVar12] = lVar1;
        lVar1 = LoadByte(S);
        (&f->upvalues->idx)[lVar12] = lVar1;
      }
      uVar4 = LoadInt(S);
      uVar13 = 0;
      ppPVar9 = (Proto **)luaM_realloc_(S->L,(void *)0x0,0,(long)(int)uVar4 * 8);
      f->p = ppPVar9;
      f->sizep = uVar4;
      uVar14 = 0;
      if (0 < (int)uVar4) {
        uVar14 = (ulong)uVar4;
      }
      for (; uVar14 != uVar13; uVar13 = uVar13 + 1) {
        f->p[uVar13] = (Proto *)0x0;
      }
      for (uVar13 = 0; uVar14 != uVar13; uVar13 = uVar13 + 1) {
        pPVar10 = luaF_newproto(S->L);
        f->p[uVar13] = pPVar10;
        LoadFunction(S,f->p[uVar13],f->source);
      }
      iVar3 = LoadInt(S);
      lVar12 = 0;
      b_00 = (int *)luaM_realloc_(S->L,(void *)0x0,0,(long)iVar3 * 4);
      f->lineinfo = b_00;
      f->sizelineinfo = iVar3;
      LoadBlock(S,b_00,(long)iVar3 * 4);
      uVar4 = LoadInt(S);
      pLVar11 = (LocVar *)luaM_realloc_(S->L,(void *)0x0,0,(long)(int)uVar4 << 4);
      f->locvars = pLVar11;
      f->sizelocvars = uVar4;
      uVar13 = 0;
      if (0 < (int)uVar4) {
        uVar13 = (ulong)uVar4;
      }
      for (; uVar13 * 0x10 != lVar12; lVar12 = lVar12 + 0x10) {
        *(undefined8 *)((long)&pLVar11->varname + lVar12) = 0;
      }
      for (lVar12 = 0; uVar13 * 0x10 != lVar12; lVar12 = lVar12 + 0x10) {
        pTVar5 = LoadString(S);
        *(TString **)((long)&f->locvars->varname + lVar12) = pTVar5;
        iVar3 = LoadInt(S);
        *(int *)((long)&f->locvars->startpc + lVar12) = iVar3;
        iVar3 = LoadInt(S);
        *(int *)((long)&f->locvars->endpc + lVar12) = iVar3;
      }
      uVar4 = LoadInt(S);
      uVar14 = 0;
      uVar13 = (ulong)uVar4;
      if ((int)uVar4 < 1) {
        uVar13 = uVar14;
      }
      for (; uVar13 * 0x10 != uVar14; uVar14 = uVar14 + 0x10) {
        pTVar5 = LoadString(S);
        *(TString **)((long)&f->upvalues->name + uVar14) = pTVar5;
      }
      return;
    }
    pTVar6 = f->k;
    bVar2 = LoadByte(S);
    uVar4 = (uint)bVar2;
    switch(bVar2) {
    case 0:
      break;
    case 1:
      bVar2 = LoadByte(S);
      *(uint *)((long)&pTVar6->value_ + lVar12) = (uint)bVar2;
      uVar4 = 1;
      break;
    case 2:
      goto switchD_00118b69_caseD_2;
    case 3:
      lVar15 = LoadNumber(S);
      *(lua_Number *)((long)&pTVar6->value_ + lVar12) = lVar15;
      uVar4 = 3;
      break;
    case 4:
switchD_00118b69_caseD_4:
      pTVar5 = LoadString(S);
      *(TString **)((long)&pTVar6->value_ + lVar12) = pTVar5;
      uVar4 = pTVar5->tt | 0x40;
      break;
    default:
      if (bVar2 == 0x13) {
        lVar7 = LoadInteger(S);
        *(lua_Integer *)((long)&pTVar6->value_ + lVar12) = lVar7;
        uVar4 = 0x13;
        break;
      }
      if (bVar2 == 0x14) goto switchD_00118b69_caseD_4;
      goto switchD_00118b69_caseD_2;
    }
    *(uint *)((long)&pTVar6->tt_ + lVar12) = uVar4;
switchD_00118b69_caseD_2:
    lVar12 = lVar12 + 0x10;
  } while( true );
}

Assistant:

static void LoadFunction(LoadState *S, Proto *f, TString *psource) {
    f->source = LoadString(S);
    if (f->source == NULL)  /* no source in dump? */
        f->source = psource;  /* reuse parent's source */
    f->linedefined = LoadInt(S);
    f->lastlinedefined = LoadInt(S);
    f->numparams = LoadByte(S);
    f->is_vararg = LoadByte(S);
    f->maxstacksize = LoadByte(S);
    LoadCode(S, f);
    LoadConstants(S, f);
    LoadUpvalues(S, f);
    LoadProtos(S, f);
    LoadDebug(S, f);
}